

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.h
# Opt level: O1

ARMMMUIdx arm_mmu_idx_el_aarch64(CPUARMState_conflict *env,int el)

{
  ulong uVar1;
  ARMMMUIdx AVar2;
  int iVar3;
  bool bVar4;
  
  uVar1 = env->features;
  if (((uint)uVar1 >> 9 & 1) != 0) {
    AVar2 = arm_v7m_mmu_idx_for_secstate_aarch64(env,(env->v7m).secure != 0);
    return AVar2;
  }
  switch(el) {
  case 0:
    if (((uVar1 & 0x200000000) == 0) || (AVar2 = ARMMMUIdx_SE10_0, ((env->cp15).scr_el3 & 1) != 0))
    {
      if ((~(env->cp15).hcr_el2 & 0x408000000) == 0) {
        bVar4 = (uVar1 & 0x210000000) == 0x10000000;
        if ((uVar1 & 0x210000000) == 0x210000000) {
          bVar4 = (bool)((*(byte *)((long)&(env->cp15).scr_el3 + 1) & 4) >> 2);
        }
        if (bVar4 != false) {
          return ARMMMUIdx_E20_0;
        }
      }
      return ARMMMUIdx_E10_0;
    }
    break;
  case 1:
    if (((uVar1 & 0x200000000) == 0) || (((env->cp15).scr_el3 & 1) != 0)) {
      bVar4 = (env->pstate & 0x400000) == 0;
      iVar3 = 0x13;
    }
    else {
      bVar4 = (env->pstate & 0x400000) == 0;
      iVar3 = 0x19;
    }
LAB_00619d65:
    return iVar3 - (uint)bVar4;
  case 2:
    AVar2 = ARMMMUIdx_E2;
    if (((env->cp15).hcr_el2 & 0x400000000) != 0) {
      bVar4 = (uVar1 & 0x210000000) == 0x10000000;
      if ((uVar1 & 0x210000000) == 0x210000000) {
        bVar4 = (bool)((*(byte *)((long)&(env->cp15).scr_el3 + 1) & 4) >> 2);
      }
      if (bVar4 != false) {
        bVar4 = (env->pstate & 0x400000) == 0;
        iVar3 = 0x16;
        goto LAB_00619d65;
      }
    }
    break;
  case 3:
    AVar2 = ARMMMUIdx_SE3;
    break;
  default:
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/helper.c"
               ,0x2d16,(char *)0x0);
  }
  return AVar2;
}

Assistant:

static inline int arm_feature(CPUARMState *env, int feature)
{
    return (env->features & (1ULL << feature)) != 0;
}